

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

double get_number(string *s)

{
  undefined8 in_RAX;
  long lVar1;
  float local_14 [2];
  float result;
  
  local_14[0] = (float)((ulong)in_RAX >> 0x20);
  lVar1 = std::__cxx11::string::find((char)s,0x2c);
  if (lVar1 != -1) {
    (s->_M_dataplus)._M_p[lVar1] = '.';
  }
  __isoc99_sscanf((s->_M_dataplus)._M_p,"%f",local_14);
  return ((double)local_14[0] * 3.141592653589793) / 180.0;
}

Assistant:

double get_number(std::string& s)
{
    size_t p = s.find(',');
    if (std::string::npos != p)
    {
        s[p] = '.';
    }
    float result;
    sscanf(s.c_str(), "%f", &result);
    return result*M_PI/180;
}